

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::GetSourceFiles
          (cmGeneratorTarget *this,vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *files,
          string *config)

{
  pointer *pppcVar1;
  iterator iVar2;
  KindedSources *pKVar3;
  pointer __args;
  pointer sourceName;
  pair<std::_Rb_tree_iterator<cmSourceFile_*>,_bool> pVar4;
  cmSourceFile *sf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srcs;
  set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_> emitted;
  cmSourceFile *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  _Rb_tree<cmSourceFile_*,_cmSourceFile_*,_std::_Identity<cmSourceFile_*>,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
  local_58;
  
  if (this->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == false) {
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetSourceFiles(this,&local_78,config);
    local_58._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_58._M_impl.super__Rb_tree_header._M_header;
    local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_58._M_impl.super__Rb_tree_header._M_header._M_right =
         local_58._M_impl.super__Rb_tree_header._M_header._M_left;
    if (local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      sourceName = local_78.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_80 = cmMakefile::GetOrCreateSource(this->Makefile,sourceName,false);
        pVar4 = std::
                _Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
                ::_M_insert_unique<cmSourceFile*const&>
                          ((_Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
                            *)&local_58,&local_80);
        if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          iVar2._M_current =
               (files->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (files->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
            _M_realloc_insert<cmSourceFile*const&>
                      ((vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)files,iVar2,&local_80)
            ;
          }
          else {
            *iVar2._M_current = local_80;
            pppcVar1 = &(files->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppcVar1 = *pppcVar1 + 1;
          }
        }
        sourceName = sourceName + 1;
      } while (sourceName !=
               local_78.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    _Rb_tree<cmSourceFile_*,_cmSourceFile_*,_std::_Identity<cmSourceFile_*>,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
    ::~_Rb_tree(&local_58);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78);
  }
  else {
    pKVar3 = GetKindedSources(this,config);
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::reserve
              (files,(long)(pKVar3->Sources).
                           super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pKVar3->Sources).
                           super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4);
    for (__args = (pKVar3->Sources).
                  super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        __args != (pKVar3->Sources).
                  super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
                  ._M_impl.super__Vector_impl_data._M_finish; __args = __args + 1) {
      iVar2._M_current =
           (files->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (files->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
        _M_realloc_insert<cmSourceFile*const&>
                  ((vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)files,iVar2,
                   &__args->Source);
      }
      else {
        *iVar2._M_current = __args->Source;
        pppcVar1 = &(files->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
      }
    }
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetSourceFiles(std::vector<cmSourceFile*>& files,
                                       const std::string& config) const
{
  if (!this->GlobalGenerator->GetConfigureDoneCMP0026()) {
    // Since we are still configuring not all sources may exist yet,
    // so we need to avoid full source classification because that
    // requires the absolute paths to all sources to be determined.
    // Since this is only for compatibility with old policies that
    // projects should not depend on anymore, just compute the files
    // without memoizing them.
    std::vector<std::string> srcs;
    this->GetSourceFiles(srcs, config);
    std::set<cmSourceFile*> emitted;
    for (std::vector<std::string>::const_iterator i = srcs.begin();
         i != srcs.end(); ++i) {
      cmSourceFile* sf = this->Makefile->GetOrCreateSource(*i);
      if (emitted.insert(sf).second) {
        files.push_back(sf);
      }
    }
    return;
  }

  KindedSources const& kinded = this->GetKindedSources(config);
  files.reserve(kinded.Sources.size());
  for (std::vector<SourceAndKind>::const_iterator si = kinded.Sources.begin();
       si != kinded.Sources.end(); ++si) {
    files.push_back(si->Source);
  }
}